

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::parse(Reader *this,istream *is,Value *root,bool collectComments)

{
  bool bVar1;
  byte in_CL;
  istream *in_RSI;
  bool in_stack_0000001f;
  Value *in_stack_00000020;
  char *in_stack_00000028;
  char *in_stack_00000030;
  Reader *in_stack_00000038;
  String doc;
  string local_40 [39];
  byte local_19;
  istream *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_40,-1);
  std::__cxx11::string::data();
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  bVar1 = parse(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                in_stack_0000001f);
  std::__cxx11::string::~string(local_40);
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& is, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(is);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since String is reference-counted, this at least does not
  // create an extra copy.
  String doc;
  std::getline(is, doc, static_cast<char>EOF);
  return parse(doc.data(), doc.data() + doc.size(), root, collectComments);
}